

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_string_rec(rf_font font,char *text,int text_len,rf_rec rec,float font_size,
                       float spacing,rf_text_wrap_mode wrap,rf_color tint)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  rf_int rVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  rf_rec source_rec;
  rf_rec dest_rec;
  rf_decoded_rune decoded_rune;
  int local_fc;
  float local_d8;
  float fStack_d4;
  float local_98;
  float fStack_94;
  rf_decoded_rune local_70;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (0 < text_len) {
    fVar20 = font_size / (float)font.base_size;
    lVar12 = (long)text_len;
    bVar17 = wrap != RF_WORD_WRAP;
    iVar1 = (int)((float)(font.base_size / 2 + font.base_size) * fVar20);
    fStack_d4 = rec.height;
    local_48 = fStack_d4;
    fStack_44 = fStack_d4;
    fStack_40 = fStack_d4;
    fStack_3c = fStack_d4;
    fStack_94 = rec.y;
    local_58 = fStack_94;
    fStack_54 = fStack_94;
    fStack_50 = fStack_94;
    fStack_4c = fStack_94;
    iVar13 = 0;
    iVar5 = 0;
    if (wrap == RF_CHAR_WRAP) {
      iVar5 = iVar1;
    }
    uVar10 = 0xffffffff;
    lVar16 = 0;
    local_fc = -1;
    iVar2 = 0;
    do {
      rf_decode_utf8_char(&local_70,text + lVar16,lVar12 - lVar16);
      lVar3 = -1;
      if (0 < font.glyphs_count) {
        lVar7 = 0;
        piVar8 = &(font.glyphs)->codepoint;
        rVar11 = font.glyphs_count;
        do {
          if (*piVar8 == local_70.codepoint) {
            lVar3 = lVar7 >> 0x20;
            break;
          }
          lVar7 = lVar7 + 0x100000000;
          piVar8 = piVar8 + 8;
          rVar11 = rVar11 + -1;
        } while (rVar11 != 0);
      }
      if (local_70.codepoint == 0x3f) {
        local_70.bytes_processed = 1;
      }
      iVar14 = 0;
      if (local_70.codepoint != 10) {
        if (font.glyphs[lVar3].advance_x == 0) {
          fVar19 = font.glyphs[lVar3].field_0.rec.width;
        }
        else {
          fVar19 = (float)font.glyphs[lVar3].advance_x;
        }
        iVar14 = (int)(fVar19 * fVar20 + spacing);
      }
      uVar15 = (lVar16 + local_70.bytes_processed) - 1;
      local_d8 = rec.width;
      if (bVar17) {
        if (local_70.codepoint == 10) {
          iVar2 = iVar2 + iVar5;
          if (wrap == RF_CHAR_WRAP) {
            iVar13 = 0;
          }
LAB_0014f568:
          bVar17 = true;
          if ((wrap != RF_CHAR_WRAP) && (iVar9 = (int)uVar10, uVar15 == (long)iVar9)) {
            iVar2 = iVar2 + iVar1;
            bVar17 = false;
            uVar10 = 0xffffffff;
            uVar4 = uVar15;
            local_fc = iVar9;
            goto LAB_0014f59f;
          }
          goto LAB_0014f5a7;
        }
        if ((wrap == RF_CHAR_WRAP) && (local_d8 <= (float)(iVar13 + iVar14 + 1))) {
          iVar2 = iVar2 + iVar1;
          iVar13 = 0;
        }
        if ((float)((int)((float)font.base_size * fVar20) + iVar2) <= local_48) {
          if ((local_70.codepoint != 9) && (local_70.codepoint != 0x20)) {
            local_98 = rec.x;
            dest_rec.x = (float)font.glyphs[lVar3].offset_x * fVar20 + (float)iVar13 + local_98;
            dest_rec.y = (float)font.glyphs[lVar3].offset_y * fVar20 + (float)iVar2 + local_58;
            dest_rec.width = font.glyphs[lVar3].field_0.rec.width * fVar20;
            dest_rec.height = font.glyphs[lVar3].field_0.rec.height * fVar20;
            source_rec._8_8_ = *(undefined8 *)((long)&font.glyphs[lVar3].field_0 + 8);
            source_rec._0_8_ = *(undefined8 *)&font.glyphs[lVar3].field_0;
            rf_draw_texture_region(font.texture,source_rec,dest_rec,(rf_vec2)0x0,0.0,tint);
          }
          goto LAB_0014f568;
        }
        bVar17 = true;
        bVar18 = false;
      }
      else {
        if ((local_70.codepoint < 0x21) &&
           ((0x100000600U >> ((ulong)local_70.codepoint & 0x3f) & 1) != 0)) {
          uVar10 = uVar15 & 0xffffffff;
        }
        uVar4 = (ulong)local_fc;
        if (local_d8 <= (float)(iVar13 + iVar14 + 1)) {
          iVar9 = (int)uVar10;
          if (iVar9 < 1) {
            iVar9 = (int)uVar15;
          }
          lVar3 = 0;
          if (uVar15 == (long)iVar9) {
            lVar3 = local_70.bytes_processed;
          }
          uVar6 = iVar9 - (int)lVar3;
          if (local_70.bytes_processed + uVar4 == (long)(int)uVar6) {
            uVar6 = (int)lVar16 - 1;
          }
          uVar10 = (ulong)uVar6;
          bVar18 = true;
        }
        else {
          bVar18 = local_70.bytes_processed + lVar16 == lVar12;
          if (bVar18) {
            uVar10 = uVar15;
          }
          uVar10 = uVar10 & 0xffffffff;
          bVar18 = bVar18 || local_70.codepoint == 10;
        }
        bVar17 = false;
        if (bVar18) {
          bVar17 = true;
LAB_0014f59f:
          iVar14 = 0;
          iVar13 = 0;
          uVar15 = uVar4;
        }
LAB_0014f5a7:
        iVar13 = iVar13 + iVar14;
        bVar18 = true;
      }
    } while ((bVar18) && (lVar16 = uVar15 + 1, lVar16 < lVar12));
  }
  return;
}

Assistant:

RF_API void rf_draw_string_rec(rf_font font, const char* text, int text_len, rf_rec rec, float font_size, float spacing, rf_text_wrap_mode wrap, rf_color tint)
{
    int   text_offset_x = 0; // Offset between characters
    int   text_offset_y = 0; // Required for line break!
    float scale_factor  = 0.0f;

    int letter = 0; // Current character
    int index  = 0; // Index position in sprite font

    scale_factor = font_size/font.base_size;

    enum
    {
        MEASURE_WORD_WRAP_STATE = 0,
        MEASURE_RESULT_STATE = 1
    };

    int state      = wrap == RF_WORD_WRAP ? MEASURE_WORD_WRAP_STATE : MEASURE_RESULT_STATE;
    int start_line = -1; // Index where to begin drawing (where a line begins)
    int end_line   = -1; // Index where to stop drawing (where a line ends)
    int lastk      = -1; // Holds last value of the character position

    for (rf_int i = 0, k = 0; i < text_len; i++, k++)
    {
        int glyph_width = 0;

        rf_decoded_rune decoded_rune = rf_decode_utf8_char(&text[i], text_len - i);
        letter = decoded_rune.codepoint;
        index  = rf_get_glyph_index(font, letter);

        // NOTE: normally we exit the decoding sequence as soon as a bad unsigned char is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set next = 1
        if (letter == 0x3f) decoded_rune.bytes_processed = 1;
        i += decoded_rune.bytes_processed - 1;

        if (letter != '\n')
        {
            glyph_width = (font.glyphs[index].advance_x == 0)?
                          (int)(font.glyphs[index].width*scale_factor + spacing):
                          (int)(font.glyphs[index].advance_x*scale_factor + spacing);
        }

        // NOTE: When wrap is ON we first measure how much of the text we can draw before going outside of the rec container
        // We store this info in start_line and end_line, then we change states, draw the text between those two variables
        // and change states again and again recursively until the end of the text (or until we get outside of the container).
        // When wrap is OFF we don't need the measure state so we go to the drawing state immediately
        // and begin drawing on the next line before we can get outside the container.
        if (state == MEASURE_WORD_WRAP_STATE)
        {
            // TODO: there are multiple types of spaces in UNICODE, maybe it's a good idea to add support for more
            // See: http://jkorpela.fi/chars/spaces.html
            if ((letter == ' ') || (letter == '\t') || (letter == '\n')) end_line = i;

            if ((text_offset_x + glyph_width + 1) >= rec.width)
            {
                end_line = (end_line < 1)? i : end_line;
                if (i == end_line) end_line -= decoded_rune.bytes_processed;
                if ((start_line + decoded_rune.bytes_processed) == end_line) end_line = i - decoded_rune.bytes_processed;
                state = !state;
            }
            else if ((i + 1) == text_len)
            {
                end_line = i;
                state = !state;
            }
            else if (letter == '\n')
            {
                state = !state;
            }

            if (state == MEASURE_RESULT_STATE)
            {
                text_offset_x = 0;
                i = start_line;
                glyph_width = 0;

                // Save character position when we switch states
                int tmp = lastk;
                lastk = k - 1;
                k = tmp;
            }
        }
        else
        {
            if (letter == '\n')
            {
                if (!wrap)
                {
                    text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                    text_offset_x = 0;
                }
            }
            else
            {
                if (!wrap && ((text_offset_x + glyph_width + 1) >= rec.width))
                {
                    text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                    text_offset_x = 0;
                }

                if ((text_offset_y + (int)(font.base_size*scale_factor)) > rec.height) break;

                // Draw glyph
                if ((letter != ' ') && (letter != '\t'))
                {
                    rf_draw_texture_region(font.texture, font.glyphs[index].rec,
                                           (rf_rec) {
                                               rec.x + text_offset_x + font.glyphs[index].offset_x * scale_factor,
                                               rec.y + text_offset_y + font.glyphs[index].offset_y * scale_factor,
                                               font.glyphs[index].width  * scale_factor,
                                               font.glyphs[index].height * scale_factor
                                           },
                                           (rf_vec2){ 0, 0 }, 0.0f, tint);
                }
            }

            if (wrap && (i == end_line))
            {
                text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                text_offset_x = 0;
                start_line = end_line;
                end_line = -1;
                glyph_width = 0;
                k = lastk;
                state = !state;
            }
        }

        text_offset_x += glyph_width;
    }
}